

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O2

FSerializer * Serialize<char>(FSerializer *arc,char *key,char **pstr,char **def)

{
  ushort uVar1;
  uint uVar2;
  FWriter *pFVar3;
  int iVar4;
  Value *this;
  Ch *cc;
  char *pcVar5;
  
  pFVar3 = arc->w;
  if (pFVar3 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      uVar1 = (this->data_).f.flags;
      if (uVar1 == 0) {
        *pstr = (char *)0x0;
      }
      else {
        if ((uVar1 >> 10 & 1) == 0) {
          __assert_fail("val->IsNull() || val->IsString()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x86f,
                        "FSerializer &Serialize(FSerializer &, const char *, char *&, char **)");
        }
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this);
        pcVar5 = UnicodeToString(cc);
        pcVar5 = copystring(pcVar5);
        *pstr = pcVar5;
      }
    }
  }
  else {
    uVar2 = (pFVar3->mInObject).Count;
    if ((((uVar2 != 0) && (def != (char **)0x0)) && ((pFVar3->mInObject).Array[uVar2 - 1] != false))
       && (iVar4 = strcmp(*pstr,*def), iVar4 == 0)) {
      return arc;
    }
    FSerializer::WriteKey(arc,key);
    if (*pstr == (char *)0x0) {
      FWriter::Null(arc->w);
    }
    else {
      FWriter::String(arc->w,*pstr);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, char *&pstr, char **def)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || def == nullptr || strcmp(pstr, *def))
		{
			arc.WriteKey(key);
			if (pstr == nullptr)
			{
				arc.w->Null();
			}
			else
			{
				arc.w->String(pstr);
			}
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsNull() || val->IsString());
			if (val->IsNull())
			{
				pstr = nullptr;
			}
			else if (val->IsString())
			{
				pstr = copystring(UnicodeToString(val->GetString()));
			}
			else
			{
				Printf(TEXTCOLOR_RED "string expected for '%s'", key);
				pstr = nullptr;
				arc.mErrors++;
			}
		}
	}
	return arc;
}